

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O1

void __thiscall
TPZSubMeshAnalysis::SetCompMesh
          (TPZSubMeshAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth)

{
  TPZCompMesh *this_00;
  TPZSubCompMesh *pTVar1;
  ulong uVar2;
  double *pdVar3;
  
  if (mesh == (TPZCompMesh *)0x0) {
    pTVar1 = (TPZSubCompMesh *)0x0;
  }
  else {
    pTVar1 = (TPZSubCompMesh *)
             __dynamic_cast(mesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
  }
  if (pTVar1 != (TPZSubCompMesh *)0x0) {
    this->fMesh = pTVar1;
    TPZAnalysis::SetCompMesh((TPZAnalysis *)this,mesh,mustOptimizeBandwidth);
    this_00 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
    if (this_00 != (TPZCompMesh *)0x0) {
      uVar2 = TPZCompMesh::NEquations(this_00);
      if (uVar2 != (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
                   (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
        pdVar3 = (this->fReferenceSolution).fElem;
        if ((pdVar3 != (double *)0x0) && (pdVar3 != (this->fReferenceSolution).fGiven)) {
          operator_delete__(pdVar3);
        }
        pdVar3 = (this->fReferenceSolution).fGiven;
        if ((pdVar3 == (double *)0x0) || ((this->fReferenceSolution).fSize < (long)uVar2)) {
          if (uVar2 == 0) {
            pdVar3 = (double *)0x0;
          }
          else {
            pdVar3 = (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
          }
        }
        (this->fReferenceSolution).fElem = pdVar3;
        if (pdVar3 == (double *)0x0 && uVar2 != 0) {
          TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
        }
      }
      (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
      (this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      (*(this->fReferenceSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])(&this->fReferenceSolution);
      return;
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/pzsmanal.cpp"
             ,0x2d);
}

Assistant:

void TPZSubMeshAnalysis::SetCompMesh(TPZCompMesh * mesh, bool mustOptimizeBandwidth)
{
    TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(mesh);
    if (submesh) {
        fMesh = submesh;
    }
    else
    {
        DebugStop();
    }
    TPZLinearAnalysis::SetCompMesh(mesh, mustOptimizeBandwidth);
    if (fCompMesh) {
        fReferenceSolution.Redim(fCompMesh->NEquations(), 1);
    }
}